

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Matrix<double> * __thiscall
nnad::Matrix<double>::Inverse(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  int *Columns;
  Matrix<double> *this_00;
  Matrix<double> adj;
  int local_70;
  int local_6c;
  Matrix<double> *local_68;
  double local_60;
  Matrix<double> local_58;
  double local_38;
  
  local_68 = this;
  if (this->_Lines != this->_Columns) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"inverse: matrix must be square.",(allocator<char> *)&local_60);
    Error((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this_00 = local_68;
  Columns = &local_68->_Columns;
  local_58._Lines = -1;
  Matrix(__return_storage_ptr__,&local_68->_Lines,Columns,&local_58._Lines);
  local_38 = Determinant(this_00);
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"inverse: Singular matrix, can\'t find its inverse",
               (allocator<char> *)&local_60);
    Error((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  Adjoint(&local_58,local_68);
  for (local_6c = 0; local_6c < local_68->_Lines; local_6c = local_6c + 1) {
    for (local_70 = 0; local_70 < *Columns; local_70 = local_70 + 1) {
      local_60 = GetElement(&local_58,&local_6c,&local_70);
      local_60 = local_60 / local_38;
      SetElement(__return_storage_ptr__,&local_6c,&local_70,&local_60);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Inverse()
    {
      if (_Lines != _Columns)
        Error("inverse: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      // Find Determinant
      T det = this->Determinant();
      if (det == 0)
        Error("inverse: Singular matrix, can't find its inverse");

      // Find Adjoint
      Matrix<T> adj = this->Adjoint();

      // Find Inverse using formula "inverse = adj/det"
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          output.SetElement(i,j, adj.GetElement(i,j) / T{det});

      return output;
    }